

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writesrc.cpp
# Opt level: O0

void usrc_writeUCPTrie(FILE *f,char *name,UCPTrie *pTrie)

{
  char local_170 [16];
  char line3 [100];
  char local_f8 [8];
  char line2 [100];
  char local_88 [8];
  char line [100];
  int32_t width;
  UCPTrie *pTrie_local;
  char *name_local;
  FILE *f_local;
  
  if (pTrie->valueWidth == '\0') {
    local_170[4] = '\x10';
    local_170[5] = '\0';
    local_170[6] = '\0';
    local_170[7] = '\0';
  }
  else {
    if (pTrie->valueWidth == '\x01') {
      local_170[0] = ' ';
      local_170[1] = '\0';
      local_170[2] = '\0';
      local_170[3] = '\0';
    }
    else {
      local_170[0] = '\0';
      local_170[1] = '\0';
      local_170[2] = '\0';
      local_170[3] = '\0';
      if (pTrie->valueWidth == '\x02') {
        local_170[0] = '\b';
        local_170[1] = '\0';
        local_170[2] = '\0';
        local_170[3] = '\0';
      }
    }
    local_170[4] = local_170[0];
    local_170[5] = local_170[1];
    local_170[6] = local_170[2];
    local_170[7] = local_170[3];
  }
  line[0x5c] = local_170[4];
  line[0x5d] = local_170[5];
  line[0x5e] = local_170[6];
  line[0x5f] = local_170[7];
  unique0x10000164 = pTrie;
  sprintf(local_88,"static const uint16_t %s_trieIndex[%%ld]={\n",name);
  sprintf(local_f8,"static const uint%d_t %s_trieData[%%ld]={\n",(ulong)(uint)line._92_4_,name);
  usrc_writeUCPTrieArrays(f,local_88,local_f8,stack0xffffffffffffffe0,"\n};\n\n");
  sprintf(local_88,"static const UCPTrie %s_trie={\n",name);
  sprintf(local_f8,"%s_trieIndex",name);
  sprintf(local_170 + 8,"%s_trieData",name);
  usrc_writeUCPTrieStruct(f,local_88,stack0xffffffffffffffe0,local_f8,local_170 + 8,"};\n\n");
  return;
}

Assistant:

U_CAPI void U_EXPORT2
usrc_writeUCPTrie(FILE *f, const char *name, const UCPTrie *pTrie) {
    int32_t width=
        pTrie->valueWidth==UCPTRIE_VALUE_BITS_16 ? 16 :
        pTrie->valueWidth==UCPTRIE_VALUE_BITS_32 ? 32 :
        pTrie->valueWidth==UCPTRIE_VALUE_BITS_8 ? 8 : 0;
    char line[100], line2[100], line3[100];
    sprintf(line, "static const uint16_t %s_trieIndex[%%ld]={\n", name);
    sprintf(line2, "static const uint%d_t %s_trieData[%%ld]={\n", (int)width, name);
    usrc_writeUCPTrieArrays(f, line, line2, pTrie, "\n};\n\n");
    sprintf(line, "static const UCPTrie %s_trie={\n", name);
    sprintf(line2, "%s_trieIndex", name);
    sprintf(line3, "%s_trieData", name);
    usrc_writeUCPTrieStruct(f, line, pTrie, line2, line3, "};\n\n");
}